

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

void probehelp(int longlist)

{
  size_t sVar1;
  char *pcVar2;
  
  fwrite("\nSyntax: probe input.pdb >> out.kin\n",0x24,1,_stderr);
  fwrite("    or: probe [flags] \"src pattern\" [\"target pattern\"] pdbfiles... >> out.kin\n\n",
         0x4f,1,_stderr);
  fwrite("Flags:\n",7,1,_stderr);
  fwrite("  -SElf  self intersection:   src  -> src (default)\n",0x34,1,_stderr);
  fwrite("  -Both  intersect both ways: src <=> targ\n",0x2b,1,_stderr);
  fwrite("  -ONce  single intersection: src  -> targ\n",0x2b,1,_stderr);
  fwrite("  -OUt   external van der Waals surface of src (solvent contact surface)\n",0x49,1,_stderr
        );
  fputc(10,_stderr);
  fwrite("  -AUTObondrot filename    read and process an autobondrot file\n",0x40,1,_stderr);
  if (longlist == 0) {
    fwrite("\n  shortcuts: <<NO FLAGS>>, -SCSurface, -EXPOsed, -ASurface, -ACCESS, -SCAN0, -SCAN1\n"
           ,0x55,1,_stderr);
    pcVar2 = "\n most simple dotkin: probe -self all -kinemage input.pdb > out.kin\n";
    sVar1 = 0x44;
  }
  else {
    fwrite("\n  shortcuts:\n",0xe,1,_stderr);
    fwrite(" <<NO FLAGS>>same as: -4H -mc -het -self \"altA ogt33\"\n",0x36,1,_stderr);
    fwrite("  -DEFAULTs  same as: <<NO FLAGS>>, but allows some other flags\n",0x40,1,_stderr);
    fwrite("  -SCSurface same as: -drop -rad1.4         -out \"not water\"\n",0x3d,1,_stderr);
    fwrite("  -EXPOsed   same as: -drop -rad1.4         -out      (note: user supplies pattern)\n",
           0x54,1,_stderr);
    fwrite("  -ASurface  same as: -drop -rad0.0 -add1.4 -out \"not water\"\n",0x3d,1,_stderr);
    fwrite("  -ACCESS    same as: -drop -rad0.0 -add1.4 -out      (note: user supplies pattern)\n",
           0x54,1,_stderr);
    fwrite("  -SCAN0 same as: -4H -mc -self \"alta blt40 ogt33\"\n",0x33,1,_stderr);
    fwrite("  -SCAN1 same as: -4H -once \"sc alta blt40 ogt33\" \"alta blt40 ogt65,(not water ogt33)\"\n"
           ,0x57,1,_stderr);
    fputc(10,_stderr);
    fwrite("  -DUMPAtominfo   count the atoms in the selection: src\n\n",0x39,1,_stderr);
    fwrite("  (note that BOTH and ONCE require two patterns while\n",0x36,1,_stderr);
    fwrite("   OUT, SELF and DUMPATOMINFO require just one pattern)\n\n",0x39,1,_stderr);
    fwrite("  -Implicit    implicit hydrogens\n",0x22,1,_stderr);
    fwrite("  -Explicit    explicit hydrogens (default)\n",0x2c,1,_stderr);
    fwrite("  -DEnsity#    set dot density (default 16 dots/sq A)\n",0x36,1,_stderr);
    fwrite("  -Radius#.#   set probe radius (default 0.25 A)\n",0x31,1,_stderr);
    fwrite("  -ADDvdw#.#   offset added to Van der Waals radii (default 0.0)\n",0x41,1,_stderr);
    fwrite("  -SCALEvdw#.# scale factor for Van der Waals radii (default 1.0)\n",0x42,1,_stderr);
    fwrite("  -COSCale#.#  scale C=O carbon Van der Waals radii (default 0.94)\n",0x43,1,_stderr);
    fwrite("  -SPike       draw spike instead of dots (default)\n",0x34,1,_stderr);
    fwrite("  -SPike#.#    set spike scale (default=0.5)\n",0x2d,1,_stderr);
    fwrite("  -NOSpike     draw only dots\n",0x1e,1,_stderr);
    fprintf(_stderr,"  -HBRegular#.# max overlap for regular Hbonds(default=%.1f)\n",
            (double)Min_regular_hb_cutoff);
    fprintf(_stderr,"  -HBCharged#.# max overlap for charged Hbonds(default=%.1f)\n",
            (double)Min_charged_hb_cutoff);
    fwrite("  -Keep        keep nonselected atoms (default)\n",0x30,1,_stderr);
    fwrite("  -DRop        drop nonselected atoms\n",0x26,1,_stderr);
    fwrite("  -LIMit       limit bump dots to max dist when kissing (default)\n",0x42,1,_stderr);
    fwrite("  -NOLIMit     do not limit bump dots\n",0x26,1,_stderr);
    fwrite("  -LENs        add lens keyword to kin file\n",0x2c,1,_stderr);
    fwrite("  -NOLENs      do not add lens keyword to kin file (default)\n",0x3d,1,_stderr);
    fwrite("  -MC          include mainchain->mainchain interactions\n",0x39,1,_stderr);
    fwrite("  -HETs        include dots to non-water HET groups (default)\n",0x3e,1,_stderr);
    fwrite("  -NOHETs      exclude dots to non-water HET groups\n",0x34,1,_stderr);
    fwrite("  -WATers      include dots to water (default)\n",0x2f,1,_stderr);
    fwrite("  -NOWATers    exclude dots to water\n",0x25,1,_stderr);
    fwrite("  -WAT2wat     show dots between waters\n",0x28,1,_stderr);
    fwrite("  -DUMPH2O     include water H? vectorlist in output\n",0x35,1,_stderr);
    fwrite("  -4H          extend bond chain dot removal to 4 for H (default)\n",0x42,1,_stderr);
    fwrite("  -3           limit bond chain dot removal to 3\n",0x31,1,_stderr);
    fwrite("  -2           limit bond chain dot removal to 2\n",0x31,1,_stderr);
    fwrite("  -1           limit bond chain dot removal to 1\n",0x31,1,_stderr);
    fwrite("  -IGNORE \"pattern\" explicit drop: ignore atoms selected by pattern\n",0x44,1,_stderr)
    ;
    fwrite("  -DOCHO       recognize CH..O Hbonds\n",0x26,1,_stderr);
    fprintf(_stderr,"  -CHO#.#      scale factor for CH..O Hbond score (default=%.1f)\n",
            (double)CHOHBfactor);
    fwrite("  -PolarH      use short radii of polar hydrogens (default)\n",0x3c,1,_stderr);
    fwrite("  -NOPolarH    do not shorten radii of polar hydrogens\n",0x37,1,_stderr);
    fwrite("  -NUClear     use nuclear position vdW radii\n",0x2e,1,_stderr);
    fwrite("               (default is electron cloud positions)\n",0x35,1,_stderr);
    fwrite("  -NOFACEhbond do not identify HBonds to aromatic faces\n\n",0x39,1,_stderr);
    fwrite("  -Name \"name\" specify the group name (default \"dots\")\n",0x37,1,_stderr);
    fwrite("  -DOTMASTER  group name used as extra master={name} on lists\n",0x3e,1,_stderr);
    fwrite("  -NOGroup     do not generate @group statement in .kin format output\n",0x46,1,_stderr)
    ;
    fwrite("  -KINemage    add @kinemage 1 statement to top of .kin format output\n\n",0x47,1,
           _stderr);
    fwrite("  -Countdots   produce a count of dots-not a dotlist\n",0x35,1,_stderr);
    fwrite("  -Unformated  output raw dot info\n",0x23,1,_stderr);
    fwrite("     name:pat:type:srcAtom:targAtom:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n"
           ,0x69,1,_stderr);
    fwrite("  -CONdense    raw output in condensed format, i.e. one line per source->target atom. Also gives the dot count for that interaction. Works only with -Unformated flag\n"
           ,0xa6,1,_stderr);
    fwrite("     name:pat:type:srcAtom:targAtom:dot-count:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n"
           ,0x73,1,_stderr);
    fwrite("  -OFORMAT     output dot info formatted for display in O\n",0x3a,1,_stderr);
    fwrite("  -XVFORMAT    output dot info formatted for display in XtalView\n",0x41,1,_stderr);
    fwrite("  -ONELINE     output one line :contacts:by:severity:type:\n",0x3b,1,_stderr);
    fwrite("  -ONEDOTeach  output one dot for each src-to-neighbor\n",0x37,1,_stderr);
    fwrite("               With -Unformated flag: for H gives angle parent-src-cause,\n",0x4a,1,
           _stderr);
    fwrite("     name:pat:type:srcAtom:targAtom:XHTangle:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n"
           ,0x72,1,_stderr);
    fwrite("  -GAPBINs     2nd pointmaster character, -.5...0...+.5\n",0x38,1,_stderr);
    fwrite("  -NEAREST     apply selection only on nearest neighbor\n",0x38,1,_stderr);
    fwrite("  -FILTERnearest apply 3rd selection on neighbor\n",0x31,1,_stderr);
    fwrite(" e.g. -nearest -filternearest patt1 all patt3\n",0x2e,1,_stderr);
    fwrite("  -OCC1filter  final filter exclude any w occ < 1\n",0x32,1,_stderr);
    fwrite("  -NOALTfilter final filter exclude any alts\n",0x2d,1,_stderr);
    fwrite("  -GAPcolor    color dots by gap amount (default)\n",0x32,1,_stderr);
    fwrite("  -ATOMcolor   color dots by atom type\n",0x27,1,_stderr);
    fwrite("  -BASEcolor   color dots by nucleic acid base type\n",0x34,1,_stderr);
    fwrite("  -COLORBase   color dots by gap and nucleic acid base type\n",0x3c,1,_stderr);
    fwrite("  -OUTCOLor \"name\" specify the point color for -OUT (default \"gray\")\n",0x45,1,
           _stderr);
    fwrite("  -GAPWeight#  set weight for scoring gaps (default 0.25)\n",0x3a,1,_stderr);
    fwrite("  -BUMPWeight# set relative scale for scoring bumps (default 10.0)\n",0x43,1,_stderr);
    fwrite("  -HBWeight#   set relative scale for scoring Hbonds (default 4.0)\n",0x43,1,_stderr);
    fwrite("  -DIVLow#.#   Division for Bump categories    (default -0.4)\n",0x3e,1,_stderr);
    fwrite("  -DIVHigh#.#  Division for Contact categories (default  0.25)\n",0x3f,1,_stderr);
    fwrite("  -DIVWorse#.#  Division for regarding a clash as a worse clash (default  -0.5)\n",0x50,
           1,_stderr);
    fwrite("  -SEPWORSE    To separate bad overlaps and worse overlaps (default false, if true, deafult value to separate the worse clashes is -0.5)\n"
           ,0x89,1,_stderr);
    fwrite("  -MINOCCupancy#.#  Occupancy below this is same as zero (default  0.02)\n",0x49,1,
           _stderr);
    fwrite("  -ELEMent     add master buttons for different elements in kin output\n",0x47,1,_stderr
          );
    fwrite("  -NOHBOUT     do not output contacts for HBonds\n",0x31,1,_stderr);
    fwrite("  -NOCLASHOUT  do not output contacts for clashes\n",0x32,1,_stderr);
    fwrite("  -NOVDWOUT    do not output contacts for van der Waals interactions\n",0x45,1,_stderr);
    fwrite("  -ONLYBADOUT  onlybadout output bad clashes (severe overlap contacts)\n",0x47,1,_stderr
          );
    fwrite("  -SUMMARY     output summary list of contacts and clashes\n",0x3b,1,_stderr);
    fwrite("  -ONELINE     output summary list on oneline\n",0x2e,1,_stderr);
    fwrite("  -NOTICKs     do not display the residue name ticker during processing\n",0x48,1,
           _stderr);
    fwrite("  -STDBONDs    assume only standard bonding patterns in standard residues\n",0x4a,1,
           _stderr);
    fwrite("  -NOPARENT    do not bond hydrogens based on table of parent heavy atoms\n\n",0x4b,1,
           _stderr);
    fwrite("  -SEGID       use the PDB SegID field to descriminate between residues\n",0x48,1,
           _stderr);
    fwrite("  -OLDU        generate old style -u output: kissEdge2BullsEye, etc\n",0x44,1,_stderr);
    fwrite("  -VErbose     verbose mode (default)\n",0x26,1,_stderr);
    fwrite("  -DOTDUMP     dump dot info while doing examineDots()\n",0x37,1,_stderr);
    fwrite("  -DUMPATOMS filename  dump atom information to filename for regression testing\n",0x50,
           1,_stderr);
    fwrite("  -REFerence   display reference string\n",0x28,1,_stderr);
    fwrite("  -CHANGEs     display a list of program changes\n",0x31,1,_stderr);
    pcVar2 = "  -Quiet       quiet mode\n";
    sVar1 = 0x1a;
  }
  fwrite(pcVar2,sVar1,1,_stderr);
  fwrite("\n  -Help  show expanded help notice (includes other flags)\n",0x3b,1,_stderr);
  fwrite("\n  -VERSION   one line version to stdout\n\n",0x2a,1,_stderr);
  fwrite("Pattern elements:  (should be put in quotes on the command line)\n",0x41,1,_stderr);
  if (longlist == 0) {
    fwrite("   #         residue number\n",0x1c,1,_stderr);
    fwrite("   #a        residue #, insert a\n",0x21,1,_stderr);
    fwrite("   #-#       residue number range\n",0x22,1,_stderr);
    fwrite("   a OR aaa  residue type by one or three letter codes\n",0x37,1,_stderr);
    fwrite("   FILE#,MODEL#,CHAINa,SEGaaaa,ALTa,ATOMaaaa,RESaaa,\n",0x35,1,_stderr);
    sVar1 = 0x3d;
    fwrite("   ALL,PROTEIN,MC,SC,BASE,ALPHA,BETA,NITROGEN,CARBON,OXYGEN,\n",0x3d,1,_stderr);
    fwrite("   SULFUR,PHOSPHORUS,HYDROGEN,METAL,POLAR,NONPOLAR,CHARGED,\n",0x3c,1,_stderr);
    fwrite("   DONOR,ACCEPTOR,AROMATIC,METHYLENE,METHYL,HET,WATER,DNA,RNA,\n",0x3f,1,_stderr);
    pcVar2 = "   OLT#, OGT#, BLT#, BGT#, INSa, WITHIN #.# OF #.#, #.#, #.#\n";
  }
  else {
    fwrite("   FILE#     within file #\n",0x1b,1,_stderr);
    fwrite("   MODEL#    within model #\n",0x1c,1,_stderr);
    fwrite("   CHAINaa   within chain a\n",0x1c,1,_stderr);
    fwrite("   SEGaaaa   segment identifier aaaa (where _ represents blank)\n",0x40,1,_stderr);
    fwrite("   ALTa      alternate conformation a\n",0x26,1,_stderr);
    fwrite("   ATOMaaaa  atom name aaaa (where _ represents blank)\n",0x37,1,_stderr);
    fwrite("             (all 4 characters are used so H would be ATOM_H__)\n",0x40,1,_stderr);
    fwrite("   RESaaa    residue aaa\n",0x19,1,_stderr);
    fwrite("   #         residue #\n",0x17,1,_stderr);
    fwrite("   #a        residue #, insert a\n",0x21,1,_stderr);
    fwrite("   #-#       residue range # (insert codes ignored)\n",0x34,1,_stderr);
    fwrite("   a         residue type by one letter codes   (eg. y)\n",0x38,1,_stderr);
    fwrite("   aaa       residue type by three letter codes (eg. tyr)\n",0x3a,1,_stderr);
    fwrite("   ALL,PROTEIN,MC,SC,BASE,ALPHA,BETA,NITROGEN,CARBON,OXYGEN,\n",0x3d,1,_stderr);
    fwrite("   SULFUR,PHOSPHORUS,HYDROGEN,METAL,POLAR,NONPOLAR,CHARGED,\n",0x3c,1,_stderr);
    fwrite("   DONOR,ACCEPTOR,AROMATIC,METHYLENE,METHYL,HET,WATER,DNA,RNA\n",0x3e,1,_stderr);
    fwrite("             all or a subset of the atoms\n",0x2a,1,_stderr);
    fwrite("   OLT#      Occupancy less than # (integer percent)\n",0x35,1,_stderr);
    fwrite("   OGT#      Occupancy greater than # (integer percent)\n",0x38,1,_stderr);
    fwrite("   BLT#      B-value less than # (integer)\n",0x2b,1,_stderr);
    fwrite("   BGT#      B-value greater than # (integer)\n",0x2e,1,_stderr);
    fwrite("   INSa      Insert code a (where _ represents blank)\n",0x36,1,_stderr);
    fwrite("   \n",4,1,_stderr);
    pcVar2 = "   WITHIN #.# OF #.#, #.#, #.#   atoms within distance from point\n";
    sVar1 = 0x42;
  }
  fwrite(pcVar2,sVar1,1,_stderr);
  fwrite("   \n",4,1,_stderr);
  fwrite("   Patterns can be combined into comma separated lists\n",0x37,1,_stderr);
  fwrite("   such as \"trp,phe,tyr\" meaning TRP or PHE or TYR.\n",0x34,1,_stderr);
  fwrite("   \n",4,1,_stderr);
  fwrite("   Patterns that are sepatated by blanks must all be true\n",0x3a,1,_stderr);
  fwrite("   such as \"chainb 1-5\" meaning residues 1 to 5 in chain B.\n",0x3c,1,_stderr);
  fwrite("   \n",4,1,_stderr);
  fwrite("   You can also group patterns with parenthesis, separate\n",0x3a,1,_stderr);
  fwrite("   multiple patterns with | meaning \'or\' and choose the\n",0x38,1,_stderr);
  fwrite("   complement with NOT as in \"not file1\" meaning not in file 1.\n",0x40,1,_stderr);
  fputc(10,_stderr);
  fwrite("   An autobondrot file is similar to other PDB input files\n",0x3b,1,_stderr);
  fwrite("   but it includes information identifying atoms subject to rotations\n",0x46,1,_stderr);
  fwrite("   and other transformations.\n",0x1e,1,_stderr);
  if (longlist != 0) {
    fwrite("\n   Example autobondrot file fragment showing Calpha-Cbeta bond rotation\n",0x49,1,
           _stderr);
    fwrite("   and a periodic torsion penalty function for this rotation\n",0x3d,1,_stderr);
    fwrite("     ATOM      1  CB  TYR    61      34.219  17.937   4.659  1.00  0.00\n",0x48,1,
           _stderr);
    fwrite("     bondrot:chi1:78.7:  0:359:5:33.138:18.517: 5.531:34.219:17.937: 4.659\n",0x4b,1,
           _stderr);
    fwrite("     cos:-3:60:3:\n",0x12,1,_stderr);
    fwrite("     ATOM      1 1HB  TYR    61      34.766  18.777   4.206  1.00  0.00\n",0x48,1,
           _stderr);
    fwrite("     ATOM      1 2HB  TYR    61      34.927  17.409   5.315  1.00  0.00\n",0x48,1,
           _stderr);
    fwrite("     ATOM      1  CG  TYR    61      33.836  16.989   3.546  1.00  0.00\n",0x48,1,
           _stderr);
    fwrite("     ...\n",9,1,_stderr);
    fwrite("   Autobondrot commands use colons to separate values\n",0x36,1,_stderr);
    fwrite("   Transformations: BONDROT:id:currAng:start:end:stepSz:x1:y1:z1:x2:y2:z2\n",0x4a,1,
           _stderr);
    fwrite("                    TRANS:  id:currpos:start:end:stepSz:x1:y1:z1:x2:y2:z2\n",0x4a,1,
           _stderr);
    fwrite("                    NULL  # dummy\n",0x22,1,_stderr);
    fwrite("   Bias functions:  COS:scale:phaseOffset:frequency\n",0x34,1,_stderr);
    fwrite("                    POLY:scale:offset:polynomialDegree\n",0x37,1,_stderr);
    fwrite("                    CONST:value\n",0x20,1,_stderr);
    fwrite("   Branching:       SAVE and RESTORE or \"(\" and \")\"\n",0x34,1,_stderr);
    fwrite("           (e.g. to rotate each Chi and the methyls for isoleucine the\n",0x47,1,_stderr
          );
    fwrite("            sequence is: rotChi1/SAVE/rotChi2/rotCD1/RESTORE/rotCG2)\n",0x45,1,_stderr);
    fwrite("   Set orientation: GO:angle1:angle2:...\n",0x29,1,_stderr);
    fwrite("   Include files:   @filename\n",0x1e,1,_stderr);
    fwrite("   Comments:        # comment text\n",0x23,1,_stderr);
  }
  fprintf(_stderr,"\n%s\n",
          "probe: version 2.26.021123, Copyright 1996-2016, J. Michael Word; 2021-2023 Richardson Lab"
         );
  exit(0);
}

Assistant:

void probehelp(int longlist)
{
   fprintf(stderr, "\nSyntax: probe input.pdb >> out.kin\n");
   fprintf(stderr, "    or: probe [flags] \"src pattern\" [\"target pattern\"] pdbfiles... >> out.kin\n\n");
   fprintf(stderr, "Flags:\n");
   fprintf(stderr, "  -SElf  self intersection:   src  -> src (default)\n");
   fprintf(stderr, "  -Both  intersect both ways: src <=> targ\n");
   fprintf(stderr, "  -ONce  single intersection: src  -> targ\n");
   fprintf(stderr, "  -OUt   external van der Waals surface of src (solvent contact surface)\n");
   fprintf(stderr, "\n");
   fprintf(stderr, "  -AUTObondrot filename    read and process an autobondrot file\n");
if (! longlist) {
   fprintf(stderr, "\n  shortcuts: <<NO FLAGS>>, -SCSurface, -EXPOsed, -ASurface, -ACCESS, -SCAN0, -SCAN1\n");
   fprintf(stderr, "\n most simple dotkin: probe -self all -kinemage input.pdb > out.kin\n");
}
else { /*longlist option*/
   fprintf(stderr, "\n  shortcuts:\n");
   fprintf(stderr, " <<NO FLAGS>>same as: -4H -mc -het -self \"altA ogt33\"\n");
                            /*changed from 3 : dcr041017*/
   fprintf(stderr, "  -DEFAULTs  same as: <<NO FLAGS>>, but allows some other flags\n"); /*dcr041101*/
   fprintf(stderr, "  -SCSurface same as: -drop -rad1.4         -out \"not water\"\n");
   fprintf(stderr, "  -EXPOsed   same as: -drop -rad1.4         -out      (note: user supplies pattern)\n");
   fprintf(stderr, "  -ASurface  same as: -drop -rad0.0 -add1.4 -out \"not water\"\n");
   fprintf(stderr, "  -ACCESS    same as: -drop -rad0.0 -add1.4 -out      (note: user supplies pattern)\n");
   fprintf(stderr, "  -SCAN0 same as: -4H -mc -self \"alta blt40 ogt33\"\n");
                        /*changed from 3 : dcr041017*/
   fprintf(stderr, "  -SCAN1 same as: -4H -once \"sc alta blt40 ogt33\" \"alta blt40 ogt65,(not water ogt33)\"\n");
                        /*changed from 3 : dcr041017*/
   fprintf(stderr, "\n");
   fprintf(stderr, "  -DUMPAtominfo   count the atoms in the selection: src\n\n");
   fprintf(stderr, "  (note that BOTH and ONCE require two patterns while\n");
   fprintf(stderr, "   OUT, SELF and DUMPATOMINFO require just one pattern)\n\n");
   fprintf(stderr, "  -Implicit    implicit hydrogens\n");
   fprintf(stderr, "  -Explicit    explicit hydrogens (default)\n");
   fprintf(stderr, "  -DEnsity#    set dot density (default 16 dots/sq A)\n");
   fprintf(stderr, "  -Radius#.#   set probe radius (default 0.25 A)\n");
   fprintf(stderr, "  -ADDvdw#.#   offset added to Van der Waals radii (default 0.0)\n");
   fprintf(stderr, "  -SCALEvdw#.# scale factor for Van der Waals radii (default 1.0)\n");
   fprintf(stderr, "  -COSCale#.#  scale C=O carbon Van der Waals radii (default 0.94)\n");
   fprintf(stderr, "  -SPike       draw spike instead of dots (default)\n");
   fprintf(stderr, "  -SPike#.#    set spike scale (default=0.5)\n");
   fprintf(stderr, "  -NOSpike     draw only dots\n");
   fprintf(stderr, "  -HBRegular#.# max overlap for regular Hbonds(default=%.1f)\n", Min_regular_hb_cutoff);
   fprintf(stderr, "  -HBCharged#.# max overlap for charged Hbonds(default=%.1f)\n", Min_charged_hb_cutoff);
   fprintf(stderr, "  -Keep        keep nonselected atoms (default)\n");
   fprintf(stderr, "  -DRop        drop nonselected atoms\n");
   fprintf(stderr, "  -LIMit       limit bump dots to max dist when kissing (default)\n");
   fprintf(stderr, "  -NOLIMit     do not limit bump dots\n");
   fprintf(stderr, "  -LENs        add lens keyword to kin file\n");
   fprintf(stderr, "  -NOLENs      do not add lens keyword to kin file (default)\n");
   fprintf(stderr, "  -MC          include mainchain->mainchain interactions\n");
   fprintf(stderr, "  -HETs        include dots to non-water HET groups (default)\n");
   fprintf(stderr, "  -NOHETs      exclude dots to non-water HET groups\n");
   fprintf(stderr, "  -WATers      include dots to water (default)\n");
   fprintf(stderr, "  -NOWATers    exclude dots to water\n");
   fprintf(stderr, "  -WAT2wat     show dots between waters\n");
   fprintf(stderr, "  -DUMPH2O     include water H? vectorlist in output\n");
   fprintf(stderr, "  -4H          extend bond chain dot removal to 4 for H (default)\n");
   fprintf(stderr, "  -3           limit bond chain dot removal to 3\n");
   fprintf(stderr, "  -2           limit bond chain dot removal to 2\n");
   fprintf(stderr, "  -1           limit bond chain dot removal to 1\n");
   fprintf(stderr, "  -IGNORE \"pattern\" explicit drop: ignore atoms selected by pattern\n");
   fprintf(stderr, "  -DOCHO       recognize CH..O Hbonds\n");
   fprintf(stderr, "  -CHO#.#      scale factor for CH..O Hbond score (default=%.1f)\n", CHOHBfactor);
   fprintf(stderr, "  -PolarH      use short radii of polar hydrogens (default)\n");
   fprintf(stderr, "  -NOPolarH    do not shorten radii of polar hydrogens\n");
   fprintf(stderr, "  -NUClear     use nuclear position vdW radii\n"); // 130114 JJH
   fprintf(stderr, "               (default is electron cloud positions)\n"); // 130114 JJH
   fprintf(stderr, "  -NOFACEhbond do not identify HBonds to aromatic faces\n\n");

   fprintf(stderr, "  -Name \"name\" specify the group name (default \"dots\")\n");
   fprintf(stderr, "  -DOTMASTER  group name used as extra master={name} on lists\n"); /*060129*/
   fprintf(stderr, "  -NOGroup     do not generate @group statement in .kin format output\n");
   fprintf(stderr, "  -KINemage    add @kinemage 1 statement to top of .kin format output\n\n");

   fprintf(stderr, "  -Countdots   produce a count of dots-not a dotlist\n");
   fprintf(stderr, "  -Unformated  output raw dot info\n");
   fprintf(stderr, "     name:pat:type:srcAtom:targAtom:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n");
   fprintf(stderr, "  -CONdense    raw output in condensed format, i.e. one line per source->target atom. Also gives the dot count for that interaction. Works only with -Unformated flag\n");
   fprintf(stderr, "     name:pat:type:srcAtom:targAtom:dot-count:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n");
   fprintf(stderr, "  -OFORMAT     output dot info formatted for display in O\n");
   fprintf(stderr, "  -XVFORMAT    output dot info formatted for display in XtalView\n");
   fprintf(stderr, "  -ONELINE     output one line :contacts:by:severity:type:\n"); /*dcr041101*/
   fprintf(stderr, "  -ONEDOTeach  output one dot for each src-to-neighbor\n"); /*dcr111013*/
   fprintf(stderr, "               With -Unformated flag: for H gives angle parent-src-cause,\n");
   fprintf(stderr, "     name:pat:type:srcAtom:targAtom:XHTangle:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n");
   fprintf(stderr, "  -GAPBINs     2nd pointmaster character, -.5...0...+.5\n"); /*dcr111020*/
   fprintf(stderr, "  -NEAREST     apply selection only on nearest neighbor\n"); /*dcr111020*/
   fprintf(stderr, "  -FILTERnearest apply 3rd selection on neighbor\n"); /*dcr111020*/
   fprintf(stderr, " e.g. -nearest -filternearest patt1 all patt3\n"); /*dcr111020*/
   fprintf(stderr, "  -OCC1filter  final filter exclude any w occ < 1\n");  /*dcr111020*/
   fprintf(stderr, "  -NOALTfilter final filter exclude any alts\n");  /*dcr111020*/
   fprintf(stderr, "  -GAPcolor    color dots by gap amount (default)\n");
   fprintf(stderr, "  -ATOMcolor   color dots by atom type\n");
   fprintf(stderr, "  -BASEcolor   color dots by nucleic acid base type\n");
   fprintf(stderr, "  -COLORBase   color dots by gap and nucleic acid base type\n");
   fprintf(stderr, "  -OUTCOLor \"name\" specify the point color for -OUT (default \"gray\")\n");
   fprintf(stderr, "  -GAPWeight#  set weight for scoring gaps (default 0.25)\n");
   fprintf(stderr, "  -BUMPWeight# set relative scale for scoring bumps (default 10.0)\n");
   fprintf(stderr, "  -HBWeight#   set relative scale for scoring Hbonds (default 4.0)\n");
   fprintf(stderr, "  -DIVLow#.#   Division for Bump categories    (default -0.4)\n");
   fprintf(stderr, "  -DIVHigh#.#  Division for Contact categories (default  0.25)\n");
   fprintf(stderr, "  -DIVWorse#.#  Division for regarding a clash as a worse clash (default  -0.5)\n"); /* 04/21/2015 SJ*/
   fprintf(stderr, "  -SEPWORSE    To separate bad overlaps and worse overlaps (default false, if true, deafult value to separate the worse clashes is -0.5)\n");
   fprintf(stderr, "  -MINOCCupancy#.#  Occupancy below this is same as zero (default  0.02)\n");
   fprintf(stderr, "  -ELEMent     add master buttons for different elements in kin output\n");
   fprintf(stderr, "  -NOHBOUT     do not output contacts for HBonds\n");
   fprintf(stderr, "  -NOCLASHOUT  do not output contacts for clashes\n");
   fprintf(stderr, "  -NOVDWOUT    do not output contacts for van der Waals interactions\n");
   fprintf(stderr, "  -ONLYBADOUT  onlybadout output bad clashes (severe overlap contacts)\n"); /*dcr041010*/
   fprintf(stderr, "  -SUMMARY     output summary list of contacts and clashes\n"); /*dcr041101*/
   fprintf(stderr, "  -ONELINE     output summary list on oneline\n"); /*dcr041101*/
   fprintf(stderr, "  -NOTICKs     do not display the residue name ticker during processing\n");
   fprintf(stderr, "  -STDBONDs    assume only standard bonding patterns in standard residues\n");
   fprintf(stderr, "  -NOPARENT    do not bond hydrogens based on table of parent heavy atoms\n\n");
   fprintf(stderr, "  -SEGID       use the PDB SegID field to descriminate between residues\n");
   fprintf(stderr, "  -OLDU        generate old style -u output: kissEdge2BullsEye, etc\n");
   fprintf(stderr, "  -VErbose     verbose mode (default)\n");
   fprintf(stderr, "  -DOTDUMP     dump dot info while doing examineDots()\n");
   fprintf(stderr, "  -DUMPATOMS filename  dump atom information to filename for regression testing\n");
   fprintf(stderr, "  -REFerence   display reference string\n");
   fprintf(stderr, "  -CHANGEs     display a list of program changes\n");
   fprintf(stderr, "  -Quiet       quiet mode\n");
}/*longlist option*/
   fprintf(stderr, "\n  -Help  show expanded help notice (includes other flags)\n");
   fprintf(stderr, "\n  -VERSION   one line version to stdout\n\n");/*dcr041009*/
   fprintf(stderr, "Pattern elements:  (should be put in quotes on the command line)\n");
if (longlist) { /*longlist option continues*/
   fprintf(stderr, "   FILE#     within file #\n");
   fprintf(stderr, "   MODEL#    within model #\n");
   fprintf(stderr, "   CHAINaa   within chain a\n");
   fprintf(stderr, "   SEGaaaa   segment identifier aaaa (where _ represents blank)\n");
   fprintf(stderr, "   ALTa      alternate conformation a\n");
   fprintf(stderr, "   ATOMaaaa  atom name aaaa (where _ represents blank)\n");
   fprintf(stderr, "             (all 4 characters are used so H would be ATOM_H__)\n");
   fprintf(stderr, "   RESaaa    residue aaa\n");
   fprintf(stderr, "   #         residue #\n");
   fprintf(stderr, "   #a        residue #, insert a\n");
   fprintf(stderr, "   #-#       residue range # (insert codes ignored)\n");
   fprintf(stderr, "   a         residue type by one letter codes   (eg. y)\n");
   fprintf(stderr, "   aaa       residue type by three letter codes (eg. tyr)\n");
   fprintf(stderr, "   ALL,PROTEIN,MC,SC,BASE,ALPHA,BETA,NITROGEN,CARBON,OXYGEN,\n");
   fprintf(stderr, "   SULFUR,PHOSPHORUS,HYDROGEN,METAL,POLAR,NONPOLAR,CHARGED,\n");
   fprintf(stderr, "   DONOR,ACCEPTOR,AROMATIC,METHYLENE,METHYL,HET,WATER,DNA,RNA\n");
   fprintf(stderr, "             all or a subset of the atoms\n");
   fprintf(stderr, "   OLT#      Occupancy less than # (integer percent)\n");
   fprintf(stderr, "   OGT#      Occupancy greater than # (integer percent)\n");
   fprintf(stderr, "   BLT#      B-value less than # (integer)\n");
   fprintf(stderr, "   BGT#      B-value greater than # (integer)\n");
   fprintf(stderr, "   INSa      Insert code a (where _ represents blank)\n");
   fprintf(stderr, "   \n");
   fprintf(stderr, "   WITHIN #.# OF #.#, #.#, #.#   atoms within distance from point\n");
}/*longlist option continues*/
else { /*NOT longlist*/
   fprintf(stderr, "   #         residue number\n");
   fprintf(stderr, "   #a        residue #, insert a\n");
   fprintf(stderr, "   #-#       residue number range\n");
   fprintf(stderr, "   a OR aaa  residue type by one or three letter codes\n");
   fprintf(stderr, "   FILE#,MODEL#,CHAINa,SEGaaaa,ALTa,ATOMaaaa,RESaaa,\n");
   fprintf(stderr, "   ALL,PROTEIN,MC,SC,BASE,ALPHA,BETA,NITROGEN,CARBON,OXYGEN,\n");
   fprintf(stderr, "   SULFUR,PHOSPHORUS,HYDROGEN,METAL,POLAR,NONPOLAR,CHARGED,\n");
   fprintf(stderr, "   DONOR,ACCEPTOR,AROMATIC,METHYLENE,METHYL,HET,WATER,DNA,RNA,\n");
   fprintf(stderr, "   OLT#, OGT#, BLT#, BGT#, INSa, WITHIN #.# OF #.#, #.#, #.#\n");
}
   fprintf(stderr, "   \n");
   fprintf(stderr, "   Patterns can be combined into comma separated lists\n");
   fprintf(stderr, "   such as \"trp,phe,tyr\" meaning TRP or PHE or TYR.\n");
   fprintf(stderr, "   \n");
   fprintf(stderr, "   Patterns that are sepatated by blanks must all be true\n");
   fprintf(stderr, "   such as \"chainb 1-5\" meaning residues 1 to 5 in chain B.\n");
   fprintf(stderr, "   \n");
   fprintf(stderr, "   You can also group patterns with parenthesis, separate\n");
   fprintf(stderr, "   multiple patterns with | meaning 'or' and choose the\n");
   fprintf(stderr, "   complement with NOT as in \"not file1\" meaning not in file 1.\n");
   fprintf(stderr, "\n");
   fprintf(stderr, "   An autobondrot file is similar to other PDB input files\n");
   fprintf(stderr, "   but it includes information identifying atoms subject to rotations\n");
   fprintf(stderr, "   and other transformations.\n");
if (longlist) { /*more longlist*/
   fprintf(stderr, "\n   Example autobondrot file fragment showing Calpha-Cbeta bond rotation\n");
   fprintf(stderr, "   and a periodic torsion penalty function for this rotation\n");
   fprintf(stderr, "     ATOM      1  CB  TYR    61      34.219  17.937   4.659  1.00  0.00\n");
   fprintf(stderr, "     bondrot:chi1:78.7:  0:359:5:33.138:18.517: 5.531:34.219:17.937: 4.659\n");
   fprintf(stderr, "     cos:-3:60:3:\n");
   fprintf(stderr, "     ATOM      1 1HB  TYR    61      34.766  18.777   4.206  1.00  0.00\n");
   fprintf(stderr, "     ATOM      1 2HB  TYR    61      34.927  17.409   5.315  1.00  0.00\n");
   fprintf(stderr, "     ATOM      1  CG  TYR    61      33.836  16.989   3.546  1.00  0.00\n");
   fprintf(stderr, "     ...\n");

   fprintf(stderr, "   Autobondrot commands use colons to separate values\n");
   fprintf(stderr, "   Transformations: BONDROT:id:currAng:start:end:stepSz:x1:y1:z1:x2:y2:z2\n");
   fprintf(stderr, "                    TRANS:  id:currpos:start:end:stepSz:x1:y1:z1:x2:y2:z2\n");
   fprintf(stderr, "                    NULL  # dummy\n");
   fprintf(stderr, "   Bias functions:  COS:scale:phaseOffset:frequency\n");
   fprintf(stderr, "                    POLY:scale:offset:polynomialDegree\n");
   fprintf(stderr, "                    CONST:value\n");
   fprintf(stderr, "   Branching:       SAVE and RESTORE or \"(\" and \")\"\n");
   fprintf(stderr, "           (e.g. to rotate each Chi and the methyls for isoleucine the\n");
   fprintf(stderr, "            sequence is: rotChi1/SAVE/rotChi2/rotCD1/RESTORE/rotCG2)\n");
   fprintf(stderr, "   Set orientation: GO:angle1:angle2:...\n");
   fprintf(stderr, "   Include files:   @filename\n");
   fprintf(stderr, "   Comments:        # comment text\n");
}/*more longlist*/
   fprintf(stderr, "\n%s\n", versionString);
   exit(0);
}